

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_UUID_struct> *a)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int count;
  ON_UUID uuid;
  uint local_3c;
  ON_UUID local_38;
  
  if (a->m_a != (ON_UUID_struct *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 4);
  }
  a->m_count = 0;
  local_3c = 0;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_3c);
  if (0 < (int)local_3c && bVar2) {
    ON_SimpleArray<ON_UUID_struct>::SetCapacity(a,(ulong)local_3c);
    if ((int)local_3c < 1) {
      bVar2 = true;
    }
    else {
      iVar3 = 1;
      do {
        bVar2 = ReadUuid(this,&local_38);
        if (!bVar2) {
          return bVar2;
        }
        ON_SimpleArray<ON_UUID_struct>::Append(a,&local_38);
        bVar1 = iVar3 < (int)local_3c;
        iVar3 = iVar3 + 1;
      } while (bVar1 && bVar2);
    }
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_UUID>& a )
{
  a.Empty();
  ON_UUID uuid;
  int i, count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadUuid( uuid );
      if ( rc )
        a.Append(uuid);
    }
  }
  return rc;
}